

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O1

void logical_or_combine_accum_help(int x,int *accum)

{
  uint uVar1;
  bool bVar2;
  
  if (x == 0x7ffffffe) {
    return;
  }
  if (x == 0x7fffffff) {
    uVar1 = 0x7fffffff;
    if (*accum != 0x7ffffffe) {
      return;
    }
  }
  else {
    if (*accum < 0x7ffffffe) {
      bVar2 = *accum == 0 && x == 0;
    }
    else {
      bVar2 = x == 0;
    }
    uVar1 = (uint)!bVar2;
  }
  *accum = uVar1;
  return;
}

Assistant:

static void logical_or_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
		*accum = (x != 0);
	} else {
		*accum = *accum || (x != 0);
	}
}